

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O3

void __thiscall tfs::TMatrix<double>::randomize(TMatrix<double> *this)

{
  double *pdVar1;
  unsigned_long uVar2;
  double *pdVar3;
  DNN_NUMERIC DVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  
  pdVar3 = this->m_data;
  if ((((pdVar3 != (double *)0x0) && (pdVar1 = this->m_end, pdVar3 < pdVar1)) &&
      (uVar2 = this->m_count, uVar2 != 0)) && (this->m_length != 0)) {
    auVar5._8_4_ = (int)(uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    dVar7 = 1.0;
    if (1.0 <= dVar6) {
      dVar7 = dVar6;
    }
    do {
      DVar4 = randomGauss();
      *pdVar3 = DVar4 * SQRT(1.0 / dVar7);
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 < pdVar1);
    return;
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                 ,"randomize",0x5e,"empty matrix");
  return;
}

Assistant:

inline bool isEmpty( void ) const { return m_data == 0 || m_data >= m_end || m_count < 1 || m_length < 1; }